

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

bool __thiscall
Am_Rich_Text_Data::Calc_Line_Dim
          (Am_Rich_Text_Data *this,Am_Drawonable *inDrawonable,Am_Text_Index inStartIndex,
          unsigned_long inTargetWidth,Am_Text_Length *outCharsOnLine,unsigned_short *outAscent,
          unsigned_short *outDescent)

{
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_short local_110;
  undefined2 local_10c;
  int local_108;
  int local_104;
  Am_Text_Fragment *local_100;
  SStyleRunInfo local_f0;
  int local_d0;
  int local_cc;
  int break_descent;
  int break_ascent;
  unsigned_long break_width_used;
  Am_Text_Length max_chars;
  Am_Text_Length break_chars_used;
  ulong local_a8;
  Am_Text_Style_Run *local_98;
  Am_Text_Style_Run *curSR;
  SStyleRunInfo sr_info;
  SBreakInfo break_info;
  Am_Text_Index chars_rem_in_sr;
  Am_Text_Index relSRIndex;
  unsigned_long cumWidth;
  unsigned_long cumChars;
  unsigned_short *outAscent_local;
  Am_Text_Length *outCharsOnLine_local;
  unsigned_long inTargetWidth_local;
  Am_Text_Index inStartIndex_local;
  Am_Drawonable *inDrawonable_local;
  Am_Rich_Text_Data *this_local;
  
  cumWidth = 0;
  relSRIndex = 0;
  chars_rem_in_sr = 0;
  *outCharsOnLine = 0;
  *outAscent = 0;
  *outDescent = 0;
  cumChars = (unsigned_long)outAscent;
  outAscent_local = (unsigned_short *)outCharsOnLine;
  outCharsOnLine_local = (Am_Text_Length *)inTargetWidth;
  inTargetWidth_local = inStartIndex;
  inStartIndex_local = (Am_Text_Index)inDrawonable;
  inDrawonable_local = (Am_Drawonable *)this;
  sr_info._8_8_ = Get_Fragment_At(this,inStartIndex,(Am_Text_Length *)&sr_info.end_frag);
  local_98 = Get_Style_Run_At(this,inTargetWidth_local,&chars_rem_in_sr);
  uVar2 = Am_Text_Style_Run::Length(local_98);
  break_info.frag = (Am_Text_Fragment *)((uVar2 - chars_rem_in_sr) + 1);
  do {
    Find_Next_Break((SBreakInfo *)&break_chars_used,(Am_Text_Index)sr_info.end_frag,
                    (Am_Text_Fragment *)sr_info._8_8_);
    uVar1 = local_a8;
    sr_info.end_frag_offset = break_chars_used;
    max_chars = 0;
    break_width_used = 0;
    _break_descent = 0;
    local_cc = 0;
    local_d0 = 0;
    while (max_chars < uVar1) {
      if (break_info.frag < (Am_Text_Fragment *)(uVar1 - max_chars)) {
        local_100 = break_info.frag;
      }
      else {
        local_100 = (Am_Text_Fragment *)(uVar1 - max_chars);
      }
      break_width_used = (unsigned_long)local_100;
      Calc_SR_Dim(&local_f0,this,(Am_Drawonable *)inStartIndex_local,local_98,
                  (Am_Text_Fragment *)sr_info._8_8_,(Am_Text_Offset)sr_info.end_frag,
                  (Am_Text_Index)local_100);
      curSR = (Am_Text_Style_Run *)local_f0.width_used;
      sr_info.width_used._0_4_ = local_f0.ascent;
      sr_info.width_used._4_4_ = local_f0.descent;
      uVar2 = sr_info.width_used;
      sr_info._8_8_ = local_f0.end_frag;
      sr_info.end_frag = (Am_Text_Fragment *)local_f0.end_frag_offset;
      _break_descent = (long)(unsigned_long *)local_f0.width_used + _break_descent;
      max_chars = break_width_used + max_chars;
      break_info.frag = (Am_Text_Fragment *)((long)break_info.frag - break_width_used);
      sr_info.width_used._0_4_ = local_f0.ascent;
      if (local_cc < (int)sr_info.width_used) {
        local_104 = (int)sr_info.width_used;
      }
      else {
        local_104 = local_cc;
      }
      local_cc = local_104;
      sr_info.width_used._4_4_ = local_f0.descent;
      if (local_d0 < sr_info.width_used._4_4_) {
        local_108 = sr_info.width_used._4_4_;
      }
      else {
        local_108 = local_d0;
      }
      local_d0 = local_108;
      sr_info.width_used = uVar2;
      if ((int)sr_info.end_frag_offset == 2) break;
      if (break_info.frag == (Am_Text_Fragment *)0x0) {
        local_98 = Am_Text_Style_Run::Next(local_98);
        if (local_98 == (Am_Text_Style_Run *)0x0) {
          Am_Error("Ran out of Style_Run info.");
        }
        break_info.frag = (Am_Text_Fragment *)Am_Text_Style_Run::Length(local_98);
      }
    }
    if (outCharsOnLine_local < (Am_Text_Length *)(relSRIndex + _break_descent)) break;
    *(Am_Text_Length *)outAscent_local = max_chars + *(long *)outAscent_local;
    if ((int)(uint)*(ushort *)cumChars < local_cc) {
      local_10c = (undefined2)local_cc;
    }
    else {
      local_10c = *(undefined2 *)cumChars;
    }
    *(undefined2 *)cumChars = local_10c;
    if ((int)(uint)*outDescent < local_d0) {
      local_110 = (unsigned_short)local_d0;
    }
    else {
      local_110 = *outDescent;
    }
    *outDescent = local_110;
    cumWidth = max_chars + cumWidth;
    relSRIndex = _break_descent + relSRIndex;
  } while ((int)sr_info.end_frag_offset != 2);
  return (bool)(-((int)sr_info.end_frag_offset == 2) & 1);
}

Assistant:

bool
Am_Rich_Text_Data::Calc_Line_Dim(Am_Drawonable *inDrawonable,
                                 Am_Text_Index inStartIndex,
                                 unsigned long inTargetWidth,
                                 Am_Text_Length &outCharsOnLine,
                                 unsigned short &outAscent,
                                 unsigned short &outDescent)
{
  unsigned long cumChars = 0, cumWidth = 0;
  Am_Text_Index relSRIndex = 0, chars_rem_in_sr = 0;
  SBreakInfo break_info;
  SStyleRunInfo sr_info;

  outCharsOnLine = 0;
  outAscent = 0;
  outDescent = 0;

  sr_info.end_frag = Get_Fragment_At(inStartIndex, sr_info.end_frag_offset);
  Am_Text_Style_Run *curSR = Get_Style_Run_At(inStartIndex, relSRIndex);

  chars_rem_in_sr = curSR->Length() - relSRIndex + 1; // incl cur char too

  // COMMENT .....
  while (true) {
    break_info = Find_Next_Break(sr_info.end_frag_offset, sr_info.end_frag);

    // this loop calculates how many pixels are needed to print until
    // the next break. There may be more than one style run until that break

    Am_Text_Length break_chars_used = 0, max_chars = 0;
    unsigned long break_width_used = 0;
    int break_ascent = 0, break_descent = 0;

    // Continue stepping through the style runs, until having processed
    // break_info.len characters or used up more pixels than were remaining
    while (break_chars_used < break_info.len) {
      max_chars = min(break_info.len - break_chars_used, chars_rem_in_sr);

      sr_info = Calc_SR_Dim(inDrawonable, curSR, sr_info.end_frag,
                            sr_info.end_frag_offset, max_chars);

      // Update data about this break
      break_width_used += sr_info.width_used;
      break_chars_used += max_chars;
      chars_rem_in_sr -= max_chars;

      break_ascent = max(sr_info.ascent, break_ascent);
      break_descent = max(sr_info.descent, break_descent);

      if (break_info.why == EndOfText)
        break;

      // skip to next style run, since there should be more test remaining
      if (chars_rem_in_sr == 0) {
        curSR = curSR->Next();
        if (curSR == nullptr) {
          Am_Error("Ran out of Style_Run info.");
          // this should never happen... eventually throw an exception
        }
        chars_rem_in_sr = curSR->Length();
      }
    }

    if (cumWidth + break_width_used <= inTargetWidth) {
      outCharsOnLine += break_chars_used;

      outAscent = max(break_ascent, outAscent);
      outDescent = max(break_descent, outDescent);
      cumChars += break_chars_used;
      cumWidth += break_width_used;
    } else
      break;

    if (break_info.why == EndOfText)
      break;
  }

  return (break_info.why == EndOfText) ? true : false;
}